

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O1

void __thiscall
libebml::EbmlMaster::Read
          (EbmlMaster *this,EbmlStream *inDataStream,EbmlSemanticContext *sContext,
          int *UpperEltFound,EbmlElement **FoundElt,bool AllowDummyElt,ScopeMode ReadFully)

{
  pointer *pppEVar1;
  EbmlElement *pEVar2;
  uint64 uVar3;
  uint64 uVar4;
  iterator __position;
  pointer ppEVar5;
  undefined8 uVar6;
  bool bVar7;
  undefined3 uVar8;
  undefined4 uVar9;
  EbmlStream *this_00;
  int iVar10;
  int iVar11;
  pointer ppEVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer ppEVar13;
  ulong uVar14;
  undefined7 in_register_00000089;
  uint64 uVar15;
  byte bVar16;
  ulong uVar17;
  EbmlElement *local_68;
  uint local_5c;
  EbmlStream *local_58;
  uint local_4c;
  EbmlElement **local_48;
  EbmlSemanticContext *local_40;
  vector<libebml::EbmlElement*,std::allocator<libebml::EbmlElement*>> *local_38;
  
  if (ReadFully != SCOPE_NO_DATA) {
    uVar14 = CONCAT71(in_register_00000089,AllowDummyElt) & 0xffffffff;
    ppEVar12 = (this->ElementList).
               super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppEVar13 = (this->ElementList).
               super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    local_58 = inDataStream;
    local_48 = FoundElt;
    local_40 = sContext;
    if (ppEVar13 != ppEVar12) {
      uVar17 = 0;
      do {
        pEVar2 = ppEVar12[uVar17];
        if ((pEVar2 != (EbmlElement *)0x0) && (pEVar2->bLocked == false)) {
          (*pEVar2->_vptr_EbmlElement[1])();
        }
        uVar17 = uVar17 + 1;
        ppEVar12 = (this->ElementList).
                   super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppEVar13 = (this->ElementList).
                   super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      } while (uVar17 < (ulong)((long)ppEVar13 - (long)ppEVar12 >> 3));
    }
    if (ppEVar13 != ppEVar12) {
      (this->ElementList).
      super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppEVar12;
    }
    uVar15 = 0x7fffffff;
    if ((this->super_EbmlElement).bSizeIsFinite == true) {
      iVar10 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
      uVar15 = CONCAT44(extraout_var,iVar10);
    }
    this_00 = local_58;
    if (uVar15 != 0) {
      (*local_58->Stream->_vptr_IOCallback[3])
                (local_58->Stream,
                 (long)(this->super_EbmlElement).SizeLength + (this->super_EbmlElement).SizePosition
                 ,0);
      local_4c = (uint)AllowDummyElt;
      local_68 = EbmlStream::FindNextElement(this_00,local_40,UpperEltFound,uVar15,AllowDummyElt,1);
      if (local_68 != (EbmlElement *)0x0) {
        local_38 = (vector<libebml::EbmlElement*,std::allocator<libebml::EbmlElement*>> *)
                   &this->ElementList;
        local_5c = (uint)CONCAT71(in_register_00000089,AllowDummyElt);
        do {
          if ((0 < *UpperEltFound) || (uVar15 == 0)) break;
          if (((this->super_EbmlElement).bSizeIsFinite == true) && (local_68->bSizeIsFinite == true)
             ) {
            uVar15 = (this->super_EbmlElement).SizePosition;
            iVar10 = CodedSizeLength((this->super_EbmlElement).Size,
                                     (this->super_EbmlElement).SizeLength,true);
            pEVar2 = local_68;
            if (local_68->bSizeIsFinite == false) {
              __assert_fail("bSizeIsFinite",
                            "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/./ebml/EbmlElement.h"
                            ,0x1d1,"uint64 libebml::EbmlElement::GetEndPosition() const");
            }
            uVar3 = local_68->SizePosition;
            uVar4 = (this->super_EbmlElement).Size;
            iVar11 = CodedSizeLength(local_68->Size,local_68->SizeLength,true);
            uVar15 = (uVar15 + (long)iVar10 + uVar4) - ((long)iVar11 + uVar3 + pEVar2->Size);
          }
          if (((char)uVar14 == '\0') &&
             (iVar10 = (*local_68->_vptr_EbmlElement[0xd])(), (char)iVar10 != '\0')) {
            if (local_68->bSizeIsFinite != true) {
              if (local_68 != (EbmlElement *)0x0) {
                (*local_68->_vptr_EbmlElement[1])();
              }
              break;
            }
            EbmlElement::SkipData(local_68,local_58,local_40,(EbmlElement *)0x0,false);
            if (local_68 != (EbmlElement *)0x0) {
              (*local_68->_vptr_EbmlElement[1])();
            }
          }
          else {
            pEVar2 = local_68;
            iVar10 = (*local_68->_vptr_EbmlElement[4])(local_68);
            (*pEVar2->_vptr_EbmlElement[0xb])
                      (pEVar2,local_58,*(undefined8 *)(CONCAT44(extraout_var_00,iVar10) + 0x18),
                       UpperEltFound,local_48,(ulong)local_4c,ReadFully);
            bVar16 = ReadFully != SCOPE_ALL_DATA | local_68->bValueIsSet;
            if (bVar16 == 1) {
              __position._M_current =
                   (this->ElementList).
                   super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this->ElementList).
                  super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<libebml::EbmlElement*,std::allocator<libebml::EbmlElement*>>::
                _M_realloc_insert<libebml::EbmlElement*const&>(local_38,__position,&local_68);
              }
              else {
                *__position._M_current = local_68;
                pppEVar1 = &(this->ElementList).
                            super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                *pppEVar1 = *pppEVar1 + 1;
              }
            }
            pEVar2 = local_68;
            if (local_68->bSizeIsFinite == true) {
              iVar10 = (*local_68->_vptr_EbmlElement[4])(local_68);
              iVar11 = 0;
              EbmlElement::SkipData
                        (pEVar2,local_58,
                         *(EbmlSemanticContext **)(CONCAT44(extraout_var_01,iVar10) + 0x18),
                         (EbmlElement *)0x0,false);
              if (bVar16 == 0) {
                uVar14 = (ulong)local_5c;
                if (local_68 != (EbmlElement *)0x0) {
                  (*local_68->_vptr_EbmlElement[1])();
                }
              }
              else {
LAB_001859b8:
                uVar14 = (ulong)local_5c;
              }
            }
            else {
              if (bVar16 == 0 && local_68 != (EbmlElement *)0x0) {
                (*local_68->_vptr_EbmlElement[1])(local_68);
              }
              iVar10 = *UpperEltFound;
              iVar11 = 6;
              if (iVar10 == 0) goto LAB_001859b8;
              *UpperEltFound = iVar10 + -1;
              iVar11 = 7;
              uVar14 = (ulong)local_5c;
              if ((iVar10 < 2) && (uVar15 != 0)) {
                local_68 = *local_48;
                iVar11 = 6;
              }
            }
            if (iVar11 != 0) {
              if (iVar11 != 6) goto LAB_00185a3d;
              break;
            }
          }
          iVar10 = *UpperEltFound;
          if (iVar10 < 1) {
            if (((iVar10 < 0) && (*UpperEltFound = iVar10 + 1, iVar10 != -1)) || (uVar15 == 0))
            goto LAB_00185a3d;
            local_68 = EbmlStream::FindNextElement
                                 (local_58,local_40,UpperEltFound,uVar15,SUB41(local_4c,0),1);
          }
          else {
            *UpperEltFound = iVar10 + -1;
            if ((iVar10 != 1) || (uVar15 == 0)) goto LAB_00185a3d;
            local_68 = *local_48;
          }
        } while (local_68 != (EbmlElement *)0x0);
      }
      if (0 < *UpperEltFound) {
        *local_48 = local_68;
      }
    }
LAB_00185a3d:
    ppEVar12 = (this->ElementList).
               super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppEVar12 !=
        (this->ElementList).
        super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        iVar10 = (*(*ppEVar12)->_vptr_EbmlElement[3])();
        if ((*(long *)(EbmlCrc32::ClassInfos._8_8_ + 8) ==
             *(long *)((int *)CONCAT44(extraout_var_02,iVar10) + 2)) &&
           (*(int *)EbmlCrc32::ClassInfos._8_8_ == *(int *)CONCAT44(extraout_var_02,iVar10))) {
          this->bChecksumUsed = true;
          pEVar2 = *ppEVar12;
          uVar15 = pEVar2->Size;
          uVar3 = pEVar2->DefaultSize;
          iVar10 = pEVar2->SizeLength;
          bVar7 = pEVar2->bSizeIsFinite;
          uVar8 = *(undefined3 *)&pEVar2->field_0x1d;
          uVar4 = pEVar2->ElementPosition;
          uVar6 = *(undefined8 *)((long)&pEVar2->SizePosition + 3);
          *(undefined8 *)
           ((long)&(this->Checksum).super_EbmlBinary.super_EbmlElement.ElementPosition + 3) =
               *(undefined8 *)((long)&pEVar2->ElementPosition + 3);
          *(undefined8 *)
           ((long)&(this->Checksum).super_EbmlBinary.super_EbmlElement.SizePosition + 3) = uVar6;
          (this->Checksum).super_EbmlBinary.super_EbmlElement.SizeLength = iVar10;
          (this->Checksum).super_EbmlBinary.super_EbmlElement.bSizeIsFinite = bVar7;
          *(undefined3 *)&(this->Checksum).super_EbmlBinary.super_EbmlElement.field_0x1d = uVar8;
          (this->Checksum).super_EbmlBinary.super_EbmlElement.ElementPosition = uVar4;
          (this->Checksum).super_EbmlBinary.super_EbmlElement.Size = uVar15;
          (this->Checksum).super_EbmlBinary.super_EbmlElement.DefaultSize = uVar3;
          (this->Checksum).super_EbmlBinary.Data = (binary *)pEVar2[1]._vptr_EbmlElement;
          uVar9 = *(undefined4 *)((long)&pEVar2[1].Size + 4);
          (this->Checksum).m_crc = *(undefined4 *)&pEVar2[1].Size;
          (this->Checksum).m_crc_final = uVar9;
          goto LAB_00185ab2;
        }
        ppEVar12 = ppEVar12 + 1;
      } while (ppEVar12 !=
               (this->ElementList).
               super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    ppEVar12 = (pointer)0x0;
LAB_00185ab2:
    if (this->bChecksumUsed == true) {
      if (*ppEVar12 != (EbmlElement *)0x0) {
        (*(*ppEVar12)->_vptr_EbmlElement[1])();
      }
      ppEVar13 = ppEVar12 + 1;
      ppEVar5 = (this->ElementList).
                super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppEVar13 != ppEVar5) {
        memmove(ppEVar12,ppEVar13,(long)ppEVar5 - (long)ppEVar13);
      }
      pppEVar1 = &(this->ElementList).
                  super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppEVar1 = *pppEVar1 + -1;
    }
    (this->super_EbmlElement).bValueIsSet = true;
  }
  return;
}

Assistant:

void EbmlMaster::Read(EbmlStream & inDataStream, const EbmlSemanticContext & sContext, int & UpperEltFound, EbmlElement * & FoundElt, bool AllowDummyElt, ScopeMode ReadFully)
{
  if (ReadFully == SCOPE_NO_DATA)
    return;

  EbmlElement * ElementLevelA;
  // remove all existing elements, including the mandatory ones...
  size_t Index;
  for (Index=0; Index<ElementList.size(); Index++) {
    if (!(*ElementList[Index]).IsLocked()) {
      delete ElementList[Index];
    }
  }
  ElementList.clear();
  uint64 MaxSizeToRead;

  if (IsFiniteSize())
    MaxSizeToRead = GetSize();
  else
    MaxSizeToRead = 0x7FFFFFFF;

  // read blocks and discard the ones we don't care about
  if (MaxSizeToRead > 0)
  {
    inDataStream.I_O().setFilePointer(GetSizePosition() + GetSizeLength(), seek_beginning);
    ElementLevelA = inDataStream.FindNextElement(sContext, UpperEltFound, MaxSizeToRead, AllowDummyElt);
    while (ElementLevelA != NULL && UpperEltFound <= 0 && MaxSizeToRead > 0) {
      if (IsFiniteSize() && ElementLevelA->IsFiniteSize())
        MaxSizeToRead = GetEndPosition() - ElementLevelA->GetEndPosition(); // even if it's the default value
      if (!AllowDummyElt && ElementLevelA->IsDummy()) {
        if (ElementLevelA->IsFiniteSize()) {
          ElementLevelA->SkipData(inDataStream, sContext);
          delete ElementLevelA; // forget this unknown element
        } else {
          delete ElementLevelA; // forget this unknown element
          break;
        }
      } else {
        ElementLevelA->Read(inDataStream, EBML_CONTEXT(ElementLevelA), UpperEltFound, FoundElt, AllowDummyElt, ReadFully);

        // Discard elements that couldn't be read properly if
        // SCOPE_ALL_DATA has been requested. This can happen
        // e.g. if block data is defective.
        bool DeleteElement = true;

        if (ElementLevelA->ValueIsSet() || (ReadFully != SCOPE_ALL_DATA)) {
          ElementList.push_back(ElementLevelA);
          DeleteElement = false;
        }

        // just in case
        if (ElementLevelA->IsFiniteSize()) {
          ElementLevelA->SkipData(inDataStream, EBML_CONTEXT(ElementLevelA));
          if (DeleteElement)
            delete ElementLevelA;
        } else {
          if (DeleteElement)
            delete ElementLevelA;

          if (UpperEltFound) {
            --UpperEltFound;
            if (UpperEltFound > 0 || MaxSizeToRead <= 0)
              goto processCrc;
            ElementLevelA = FoundElt;
          }

          break;
        }
      }

      if (UpperEltFound > 0) {
        UpperEltFound--;
        if (UpperEltFound > 0 || MaxSizeToRead <= 0)
          goto processCrc;
        ElementLevelA = FoundElt;
        continue;
      }

      if (UpperEltFound < 0) {
        UpperEltFound++;
        if (UpperEltFound < 0)
          goto processCrc;
      }

      if (MaxSizeToRead <= 0)
        goto processCrc;// this level is finished

      ElementLevelA = inDataStream.FindNextElement(sContext, UpperEltFound, MaxSizeToRead, AllowDummyElt);
    }
    if (UpperEltFound > 0) {
      FoundElt = ElementLevelA;
    }
  }
processCrc:

  EBML_MASTER_ITERATOR Itr, CrcItr;
  for (Itr = ElementList.begin(); Itr != ElementList.end();) {
    if ((EbmlId)(*(*Itr)) == EBML_ID(EbmlCrc32)) {
      bChecksumUsed = true;
      // remove the element
      Checksum = *(static_cast<EbmlCrc32*>(*Itr));
      CrcItr = Itr;
      break;
    }
    ++Itr;
  }

  if (bChecksumUsed)
  {
    delete *CrcItr;
    Remove(CrcItr);
  }

  SetValueIsSet();
}